

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipkinCollector.cpp
# Opt level: O3

ssize_t __thiscall
twitter::zipkin::thrift::ZipkinCollector_submitZipkinBatch_result::write
          (ZipkinCollector_submitZipkinBatch_result *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 in_register_00000034;
  long *plVar4;
  pointer pRVar5;
  
  plVar4 = (long *)CONCAT44(in_register_00000034,__fd);
  iVar1 = (**(code **)(*plVar4 + 0x20))(plVar4,"ZipkinCollector_submitZipkinBatch_result");
  if (((byte)this->__isset & 1) != 0) {
    iVar2 = (**(code **)(*plVar4 + 0x30))(plVar4,"success",0xf,0);
    iVar3 = (**(code **)(*plVar4 + 0x58))
                      (plVar4,0xc,
                       (ulong)((long)(this->success).
                                     super__Vector_base<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->success).
                                    super__Vector_base<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
    iVar3 = iVar3 + iVar2 + iVar1;
    for (pRVar5 = (this->success).
                  super__Vector_base<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pRVar5 != (this->success).
                  super__Vector_base<twitter::zipkin::thrift::Response,_std::allocator<twitter::zipkin::thrift::Response>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pRVar5 = pRVar5 + 1) {
      iVar1 = (**(code **)(*(long *)pRVar5 + 0x18))(pRVar5,plVar4);
      iVar3 = iVar3 + iVar1;
    }
    iVar1 = (**(code **)(*plVar4 + 0x60))(plVar4);
    iVar2 = (**(code **)(*plVar4 + 0x38))(plVar4);
    iVar1 = iVar2 + iVar1 + iVar3;
  }
  iVar2 = (**(code **)(*plVar4 + 0x40))(plVar4);
  iVar3 = (**(code **)(*plVar4 + 0x28))(plVar4);
  return (ulong)(uint)(iVar3 + iVar2 + iVar1);
}

Assistant:

uint32_t ZipkinCollector_submitZipkinBatch_result::write(::apache::thrift::protocol::TProtocol* oprot) const {

  uint32_t xfer = 0;

  xfer += oprot->writeStructBegin("ZipkinCollector_submitZipkinBatch_result");

  if (this->__isset.success) {
    xfer += oprot->writeFieldBegin("success", ::apache::thrift::protocol::T_LIST, 0);
    {
      xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRUCT, static_cast<uint32_t>(this->success.size()));
      std::vector<Response> ::const_iterator _iter35;
      for (_iter35 = this->success.begin(); _iter35 != this->success.end(); ++_iter35)
      {
        xfer += (*_iter35).write(oprot);
      }
      xfer += oprot->writeListEnd();
    }
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}